

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall BotscriptParser::parseBreak(BotscriptParser *this)

{
  int iVar1;
  DataBuffer *pDVar2;
  ScopeInfo *pSVar3;
  BotscriptParser *this_local;
  
  if (this->m_scopeCursor == 0) {
    error<>("unexpected `break`");
  }
  pDVar2 = currentBuffer(this);
  DataBuffer::writeHeader(pDVar2,Goto);
  pSVar3 = List<ScopeInfo>::operator[](&this->m_scopeStack,this->m_scopeCursor);
  iVar1 = (int)(char)pSVar3->type;
  if (iVar1 != 1) {
    if (iVar1 - 2U < 2) {
      pDVar2 = currentBuffer(this);
      pSVar3 = List<ScopeInfo>::operator[](&this->m_scopeStack,this->m_scopeCursor);
      DataBuffer::addReference(pDVar2,pSVar3->mark2);
      goto LAB_00160a49;
    }
    if (iVar1 != 5) {
      error<>("unexpected `break`");
      goto LAB_00160a49;
    }
  }
  pDVar2 = currentBuffer(this);
  pSVar3 = List<ScopeInfo>::operator[](&this->m_scopeStack,this->m_scopeCursor);
  DataBuffer::addReference(pDVar2,pSVar3->mark1);
LAB_00160a49:
  Lexer::mustGetNext(this->m_lexer,Semicolon);
  return;
}

Assistant:

void BotscriptParser::parseBreak()
{
	if (m_scopeCursor == 0)
		error ("unexpected `break`");

	currentBuffer()->writeHeader (DataHeader::Goto);

	// switch and if use mark1 for the closing point,
	// for and while use mark2.
	switch (SCOPE (0).type)
	{
		case SCOPE_If:
		case SCOPE_Switch:
			currentBuffer()->addReference (SCOPE (0).mark1);
			break;

		case SCOPE_For:
		case SCOPE_While:
			currentBuffer()->addReference (SCOPE (0).mark2);
			break;

		default:
			error ("unexpected `break`");
			break;
	}

	m_lexer->mustGetNext (Token::Semicolon);
}